

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true> __thiscall
duckdb::SimpleMultiFileList::ComplexFilterPushdown
          (SimpleMultiFileList *this,ClientContext *context_p,MultiFileOptions *options,
          MultiFilePushdownInfo *info,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *filters)

{
  bool bVar1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_R9;
  vector<duckdb::OpenFileInfo,_true> file_copy;
  _func_int **local_50;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_48;
  
  if ((*(char *)((long)&info->table_index + 1) == '\0') && ((char)info->table_index == '\0')) {
    (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)0x0;
  }
  else {
    ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::vector
              (&local_48,
               (vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
               &(context_p->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar1 = PushdownInternal((ClientContext *)options,(MultiFileOptions *)info,
                             (MultiFilePushdownInfo *)filters,in_R9,
                             (vector<duckdb::OpenFileInfo,_true> *)&local_48);
    if (bVar1) {
      make_uniq<duckdb::SimpleMultiFileList,duckdb::vector<duckdb::OpenFileInfo,true>&>
                ((duckdb *)&local_50,(vector<duckdb::OpenFileInfo,_true> *)&local_48);
      (this->super_MultiFileList)._vptr_MultiFileList = local_50;
    }
    else {
      (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)0x0;
    }
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_48);
  }
  return (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)
         (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)this;
}

Assistant:

unique_ptr<MultiFileList> SimpleMultiFileList::ComplexFilterPushdown(ClientContext &context_p,
                                                                     const MultiFileOptions &options,
                                                                     MultiFilePushdownInfo &info,
                                                                     vector<unique_ptr<Expression>> &filters) {
	if (!options.hive_partitioning && !options.filename) {
		return nullptr;
	}

	// FIXME: don't copy list until first file is filtered
	auto file_copy = paths;
	auto res = PushdownInternal(context_p, options, info, filters, file_copy);

	if (res) {
		return make_uniq<SimpleMultiFileList>(file_copy);
	}

	return nullptr;
}